

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

bool __thiscall
llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
parse(parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this
     ,Option *param_1,StringRef param_2,StringRef Arg,string *Value)

{
  string local_58;
  Option *local_38;
  Option *param_1_local;
  parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  StringRef Arg_local;
  StringRef param_2_local;
  
  Arg_local.Data = (char *)Arg.Length;
  this_local = (parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)Arg.Data;
  Arg_local.Length = (size_t)param_2.Data;
  local_38 = param_1;
  param_1_local = (Option *)this;
  StringRef::str_abi_cxx11_(&local_58,(StringRef *)&this_local);
  std::__cxx11::string::operator=((string *)Value,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return false;
}

Assistant:

bool parse(Option &, StringRef, StringRef Arg, std::string &Value) {
    Value = Arg.str();
    return false;
  }